

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O1

void test_bus_aio_stopped(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_msg *local_50;
  nng_msg *msg;
  nng_aio *aio1;
  nng_aio *aio2;
  nng_socket s1;
  
  nVar1 = nng_bus0_open((nng_socket *)((long)&aio2 + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0xbd,"%s: expected success, got %s (%d)","nng_bus0_open(&s1)",pcVar3,nVar1
                        );
  if (iVar2 != 0) {
    nVar1 = nng_msg_alloc(&local_50,0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0xbe,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3
                           ,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_aio_alloc((nng_aio **)&msg,(_func_void_void_ptr *)0x0,(void *)0x0);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0xbf,"%s: expected success, got %s (%d)",
                             "nng_aio_alloc(&aio1, NULL, NULL)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_aio_alloc(&aio1,(_func_void_void_ptr *)0x0,(void *)0x0);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                               ,0xc0,"%s: expected success, got %s (%d)",
                               "nng_aio_alloc(&aio2, NULL, NULL)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nng_aio_stop((nng_aio *)msg);
          nng_aio_stop(aio1);
          nng_socket_recv(aio2._4_4_,(nng_aio *)msg);
          nng_aio_wait((nng_aio *)msg);
          nVar1 = nng_aio_result((nng_aio *)msg);
          pcVar3 = nng_strerror(NNG_ESTOPPED);
          acutest_check_((uint)(nVar1 == NNG_ESTOPPED),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0xc6,"%s fails with %s","nng_aio_result(aio1)",pcVar3);
          pcVar3 = nng_strerror(NNG_ESTOPPED);
          pcVar4 = nng_strerror(nVar1);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio1)",pcVar3,999,
                           pcVar4,(ulong)nVar1);
          nng_aio_set_msg(aio1,local_50);
          nng_socket_send(aio2._4_4_,aio1);
          nng_aio_wait(aio1);
          nVar1 = nng_aio_result(aio1);
          pcVar3 = nng_strerror(NNG_ESTOPPED);
          acutest_check_((uint)(nVar1 == NNG_ESTOPPED),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0xcb,"%s fails with %s","nng_aio_result(aio2)",pcVar3);
          pcVar3 = nng_strerror(NNG_ESTOPPED);
          pcVar4 = nng_strerror(nVar1);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio2)",pcVar3,999,
                           pcVar4,(ulong)nVar1);
          nng_aio_free((nng_aio *)msg);
          nng_aio_free(aio1);
          nng_msg_free(local_50);
          nVar1 = nng_socket_close(aio2._4_4_);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                 ,0xd0,"%s: expected success, got %s (%d)","nng_socket_close(s1)",
                                 pcVar3,nVar1);
          if (iVar2 != 0) {
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_bus_aio_stopped(void)
{
	nng_socket s1;
	nng_aio   *aio1;
	nng_aio   *aio2;
	nng_msg   *msg;

	NUTS_PASS(nng_bus0_open(&s1));
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));
	nng_aio_stop(aio1);
	nng_aio_stop(aio2);

	nng_socket_recv(s1, aio1);
	nng_aio_wait(aio1);
	NUTS_FAIL(nng_aio_result(aio1), NNG_ESTOPPED);

	nng_aio_set_msg(aio2, msg);
	nng_socket_send(s1, aio2);
	nng_aio_wait(aio2);
	NUTS_FAIL(nng_aio_result(aio2), NNG_ESTOPPED);

	nng_aio_free(aio1);
	nng_aio_free(aio2);
	nng_msg_free(msg);
	NUTS_CLOSE(s1);
}